

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcabs1.c
# Opt level: O0

doublereal dcabs1_(doublecomplex *z)

{
  double local_40;
  double local_30;
  doublecomplex equiv_0 [1];
  doublereal ret_val;
  doublecomplex *z_local;
  
  local_30 = z->r;
  local_40 = z->i;
  if (local_30 < 0.0) {
    local_30 = -local_30;
  }
  if (local_40 < 0.0) {
    local_40 = -local_40;
  }
  return local_30 + local_40;
}

Assistant:

doublereal dcabs1_(doublecomplex *z)
{
/* >>Start of File<<   

       System generated locals */
    doublereal ret_val;
    doublecomplex equiv_0[1];

    /* Local variables */
#define t ((doublereal *)equiv_0)
#define zz (equiv_0)

    zz->r = z->r, zz->i = z->i;
    ret_val = abs(t[0]) + abs(t[1]);
    return ret_val;
}